

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateUniqueHandles_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this)

{
  pointer pFVar1;
  pointer pEVar2;
  string *__return_storage_ptr___00;
  ExtensionData *extension;
  pointer pEVar3;
  FeatureData *feature;
  pointer title;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string uniqueHandles;
  string uniqueHandlesTemplate;
  allocator_type local_ea;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  string local_88;
  string *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_68 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "\n#ifndef VULKAN_HPP_NO_SMART_HANDLE\n  //======================\n  //=== UNIQUE HANDLEs ===\n  //======================\n\n${uniqueHandles}\n#endif  /*VULKAN_HPP_NO_SMART_HANDLE*/\n"
             ,"");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  title = (this->m_features).
          super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (title != pFVar1) {
    do {
      generateUniqueHandle(&local_c8.first,this,&title->requireData,&title->name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_e8,local_c8.first._M_dataplus._M_p,local_c8.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.first._M_dataplus._M_p != &local_c8.first.field_2) {
        operator_delete(local_c8.first._M_dataplus._M_p,
                        local_c8.first.field_2._M_allocated_capacity + 1);
      }
      title = title + 1;
    } while (title != pFVar1);
  }
  pEVar3 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar3 != pEVar2) {
    do {
      generateUniqueHandle(&local_c8.first,this,&pEVar3->requireData,&pEVar3->name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_e8,local_c8.first._M_dataplus._M_p,local_c8.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.first._M_dataplus._M_p != &local_c8.first.field_2) {
        operator_delete(local_c8.first._M_dataplus._M_p,
                        local_c8.first.field_2._M_allocated_capacity + 1);
      }
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar2);
  }
  if (local_e8._M_dataplus._M_p[local_e8._M_string_length - 1] == '\n') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (&local_e8);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_c8,(char (*) [14])"uniqueHandles",&local_e8);
  __return_storage_ptr___00 = local_68;
  __l._M_len = 1;
  __l._M_array = &local_c8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_60,__l,&local_e9,&local_ea);
  replaceWithMap(__return_storage_ptr___00,&local_88,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.second._M_dataplus._M_p != &local_c8.second.field_2) {
    operator_delete(local_c8.second._M_dataplus._M_p,
                    local_c8.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.first._M_dataplus._M_p != &local_c8.first.field_2) {
    operator_delete(local_c8.first._M_dataplus._M_p,local_c8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr___00;
}

Assistant:

std::string VulkanHppGenerator::generateUniqueHandles() const
{
  std::string uniqueHandlesTemplate = R"(
#ifndef VULKAN_HPP_NO_SMART_HANDLE
  //======================
  //=== UNIQUE HANDLEs ===
  //======================

${uniqueHandles}
#endif  /*VULKAN_HPP_NO_SMART_HANDLE*/
)";

  std::string uniqueHandles;
  for ( auto const & feature : m_features )
  {
    uniqueHandles += generateUniqueHandle( feature.requireData, feature.name );
  }
  for ( auto const & extension : m_extensions )
  {
    uniqueHandles += generateUniqueHandle( extension.requireData, extension.name );
  }
  if ( uniqueHandles.back() == '\n' )
  {
    uniqueHandles.pop_back();
  }
  return replaceWithMap( uniqueHandlesTemplate, { { "uniqueHandles", uniqueHandles } } );
}